

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

string * amrex::UniqueString_abi_cxx11_(void)

{
  undefined4 uVar1;
  ostream *this;
  void *this_00;
  string *in_RDI;
  double dVar2;
  int tsl;
  stringstream tempstring;
  string local_1e8 [32];
  string local_1c8 [32];
  undefined4 local_1a8;
  int local_194;
  stringstream local_190 [16];
  ostream local_180 [384];
  
  std::__cxx11::stringstream::stringstream(local_190);
  local_194 = (int)std::setprecision(0xb);
  this = std::operator<<(local_180,(_Setprecision)local_194);
  this_00 = (void *)std::ostream::operator<<(this,std::fixed);
  dVar2 = ParallelDescriptor::second();
  std::ostream::operator<<(this_00,dVar2);
  std::__cxx11::stringstream::str();
  uVar1 = std::__cxx11::string::length();
  std::__cxx11::string::~string(local_1c8);
  local_1a8 = uVar1;
  std::__cxx11::stringstream::str();
  std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::stringstream::~stringstream(local_190);
  return in_RDI;
}

Assistant:

std::string
amrex::UniqueString()
{
  std::stringstream tempstring;
  tempstring << std::setprecision(11) << std::fixed << ParallelDescriptor::second();
  int tsl(tempstring.str().length());
  return(tempstring.str().substr(tsl/2, tsl));
}